

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void CLIntercept::eventCallbackCaller(cl_event event,cl_int status,void *user_data)

{
  CLIntercept *this;
  uint64_t enqueueCounter;
  time_point tickStart;
  time_point tickEnd;
  string local_50;
  
  this = *user_data;
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((this->m_Config).CallLogging == true) {
    CEnumNameMap::name_command_exec_status_abi_cxx11_(&local_50,&this->m_EnumNameMap,status);
    callLoggingEnter(this,"eventCallbackCaller",enqueueCounter,(cl_kernel)0x0,
                     "event = %p, status = %s (%d)",event,local_50._M_dataplus._M_p,
                     (ulong)(uint)status);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  tickStart.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if (*(code **)((long)user_data + 8) != (code *)0x0) {
    (**(code **)((long)user_data + 8))
              (event,(ulong)(uint)status,*(undefined8 *)((long)user_data + 0x10));
  }
  tickEnd.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if ((this->m_Config).CallLogging == true) {
    callLoggingExit(this,"eventCallbackCaller",0,(cl_event *)0x0,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    chromeCallLoggingExit(this,"eventCallbackCaller",&local_50,false,0,tickStart,tickEnd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  operator_delete(user_data);
  return;
}

Assistant:

void CLIntercept::eventCallbackCaller(
    cl_event event,
    cl_int status,
    void* user_data )
{
    SEventCallbackInfo* pEventCallbackInfo =
        (SEventCallbackInfo*)user_data;

    CLIntercept*    pIntercept = pEventCallbackInfo->pIntercept;

    GET_ENQUEUE_COUNTER();
    CALL_LOGGING_ENTER( "event = %p, status = %s (%d)",
        event,
        pIntercept->enumName().name_command_exec_status( status ).c_str(),
        status );

    clock::time_point   cpuStart = clock::now();

    pIntercept->eventCallback(
        event,
        status );
    if( pEventCallbackInfo->pApplicationCallback )
    {
        pEventCallbackInfo->pApplicationCallback(
            event,
            status,
            pEventCallbackInfo->pUserData );
    }

    clock::time_point   cpuEnd = clock::now();

    CALL_LOGGING_EXIT( CL_SUCCESS );

    delete pEventCallbackInfo;
}